

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_modes_b(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,
                  TokenExtra **tok,TokenExtra *tok_end,int mi_row,int mi_col)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  uint bh_00;
  uint bw_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  TileInfo *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_stack_00000008;
  int in_stack_00000010;
  int end;
  int start;
  int idx;
  int idy;
  int height;
  int width;
  int txbw;
  int txbh;
  TX_SIZE max_tx_size;
  uint8_t segment_id;
  int skip_txfm;
  int is_inter_tx;
  MapCdf map_pb_cdf;
  int cols;
  int rows;
  uint8_t palette_size_plane;
  int plane;
  int bw;
  int bh;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  int grid_idx;
  FRAME_CONTEXT *tile_ctx;
  MACROBLOCKD *xd;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  TX_SIZE tx_size;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  AV1_COMP *in_stack_ffffffffffffff30;
  aom_writer *w_00;
  MACROBLOCKD *xd_00;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int iVar10;
  int local_7c;
  int local_78;
  char local_71;
  int iVar11;
  int plane_00;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar12;
  byte bVar13;
  aom_writer *w_01;
  undefined4 in_stack_ffffffffffffffa8;
  AV1_COMP *cpi_00;
  
  cpi_00 = *(AV1_COMP **)(in_RSI + 0x2b38);
  iVar2 = in_stack_00000008 * *(int *)(in_RDI + 0x3c1c4) + in_stack_00000010;
  *(long *)(in_RSI + 0x2058) = *(long *)(in_RDI + 0x3c1b8) + (long)iVar2 * 8;
  xd_00 = *(MACROBLOCKD **)(in_RDI + 0x3bf50);
  iVar3 = get_mi_ext_idx(in_stack_00000008,in_stack_00000010,*(BLOCK_SIZE *)(in_RDI + 0x3c1b0),
                         *(int *)(in_RDI + 0x3bf5c));
  *(long *)(in_RSI + 0x4178) = (long)xd_00->plane[0].pre + (long)iVar3 * 0x54 + -0x40;
  *(long *)(in_RSI + 0x2088) = *(long *)(in_RDI + 0x3c1c8) + (long)iVar2;
  *(undefined4 *)(in_RSI + 0x2090) = *(undefined4 *)(in_RDI + 0x3c1c4);
  w_01 = (aom_writer *)**(long **)(in_RSI + 0x2058);
  bVar13 = (byte)w_01->pos;
  uVar12 = CONCAT13(bVar13,(int3)in_stack_ffffffffffffff9c);
  bh_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bVar13]
  ;
  bw_00 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar13]
  ;
  iVar3 = *(int *)(in_RDI + 0x3c198);
  set_mi_row_col((MACROBLOCKD *)(in_RSI + 0x1a0),in_RDX,in_stack_00000008,bh_00,in_stack_00000010,
                 bw_00,*(int *)(in_RDI + 0x3c194),iVar3);
  *(long *)(in_RSI + 0x2160) =
       *(long *)(*(long *)(in_RDI + 0x42298) + (long)in_RDX->tile_row * 8) + (long)in_stack_00000010
  ;
  *(long *)(in_RSI + 0x2168) = in_RSI + 0x2170 + (long)(int)(in_stack_00000008 & 0x1f);
  write_mbmi_b(in_stack_ffffffffffffff30,
               (ThreadData_conflict *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (aom_writer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  iVar11 = 0;
  while( true ) {
    plane_00 = iVar11;
    iVar4 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    if (iVar4 < 3) {
      iVar4 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    }
    else {
      iVar4 = 2;
    }
    if (iVar4 <= iVar11) break;
    local_71 = *(char *)((long)&w_01[2].ec.offs + (long)plane_00 + 2);
    if (local_71 != '\0') {
      av1_get_block_dimensions
                ((BLOCK_SIZE)w_01->pos,plane_00,(MACROBLOCKD *)(in_RSI + 0x1a0),(int *)0x0,
                 (int *)0x0,&local_78,&local_7c);
      if (plane_00 == 0) {
        w_00 = (aom_writer *)((cpi_00->enc_quant_dequant_params).quants.y_zbin[0x6c] + 4);
      }
      else {
        w_00 = (aom_writer *)((cpi_00->enc_quant_dequant_params).quants.y_zbin[0x93] + 7);
      }
      pack_map_tokens(w_00,(TokenExtra **)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                      (MapCdf)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    iVar11 = plane_00 + 1;
  }
  iVar5 = is_inter_block((MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff14,iVar3));
  tx_size = (TX_SIZE)((uint)in_stack_ffffffffffffff24 >> 0x18);
  uVar6 = (uint)(byte)w_01[2].ec.low;
  uVar1 = *(undefined2 *)&w_01[2].field_0x37;
  if ((((*(char *)(in_RDI + 0x3c178) == '\x02') &&
       (iVar7 = block_signals_txsize((BLOCK_SIZE)((uint)uVar12 >> 0x18)), iVar7 != 0)) &&
      ((iVar5 == 0 || (uVar6 == 0)))) &&
     (*(int *)(in_RSI + 0x2b64 + (ulong)((byte)uVar1 & 7) * 4) == 0)) {
    if (iVar5 == 0) {
      write_selected_tx_size(xd_00,(aom_writer *)CONCAT44(iVar11,iVar4));
      set_txfm_ctxs(tx_size,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                    in_stack_ffffffffffffff18,
                    (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff14,iVar3));
    }
    else {
      iVar4 = get_vartx_max_txsize
                        ((MACROBLOCKD *)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (BLOCK_SIZE)((uint)in_stack_ffffffffffffff14 >> 0x18),iVar3);
      iVar11 = tx_size_high_unit[(byte)iVar4];
      iVar4 = tx_size_wide_unit[(byte)iVar4];
      bVar13 = (byte)((uint)uVar12 >> 0x18);
      uVar8 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bVar13];
      uVar9 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bVar13];
      for (iVar7 = 0; iVar7 < (int)uVar9; iVar7 = iVar11 + iVar7) {
        for (iVar10 = 0; iVar10 < (int)uVar8; iVar10 = iVar4 + iVar10) {
          write_tx_size_vartx((MACROBLOCKD *)CONCAT44(iVar4,uVar8),
                              (MB_MODE_INFO *)CONCAT44(uVar9,iVar7),(TX_SIZE)((uint)iVar10 >> 0x18),
                              in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                              in_stack_ffffffffffffff48,(aom_writer *)CONCAT44(iVar5,uVar6));
        }
      }
    }
  }
  else {
    set_txfm_ctxs('\0',CONCAT13(*(undefined1 *)((long)&w_01[2].ec.low + 1),
                                (int3)in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c,
                  in_stack_ffffffffffffff18,(MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff14,iVar3)
                 );
  }
  if ((char)w_01[2].ec.low == '\0') {
    iVar11 = aom_tell_size((aom_writer *)CONCAT44(in_stack_ffffffffffffff14,iVar3));
    write_tokens_b(cpi_00,(MACROBLOCK *)CONCAT44(iVar2,in_stack_ffffffffffffffa8),w_01,
                   (TokenExtra **)CONCAT44(uVar12,bh_00),(TokenExtra *)CONCAT44(bw_00,plane_00));
    iVar3 = aom_tell_size((aom_writer *)CONCAT44(in_stack_ffffffffffffff14,iVar3));
    *(int *)(in_RSI + 0x25d58) = (iVar3 - iVar11) + *(int *)(in_RSI + 0x25d58);
  }
  return;
}

Assistant:

static inline void write_modes_b(AV1_COMP *cpi, ThreadData *const td,
                                 const TileInfo *const tile, aom_writer *w,
                                 const TokenExtra **tok,
                                 const TokenExtra *const tok_end, int mi_row,
                                 int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCKD *xd = &td->mb.e_mbd;
  FRAME_CONTEXT *tile_ctx = xd->tile_ctx;
  const int grid_idx = mi_row * mi_params->mi_stride + mi_col;
  xd->mi = mi_params->mi_grid_base + grid_idx;
  td->mb.mbmi_ext_frame =
      cpi->mbmi_ext_info.frame_base +
      get_mi_ext_idx(mi_row, mi_col, cm->mi_params.mi_alloc_bsize,
                     cpi->mbmi_ext_info.stride);
  xd->tx_type_map = mi_params->tx_type_map + grid_idx;
  xd->tx_type_map_stride = mi_params->mi_stride;

  const MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize <= cm->seq_params->sb_size ||
         (bsize >= BLOCK_SIZES && bsize < BLOCK_SIZES_ALL));

  const int bh = mi_size_high[bsize];
  const int bw = mi_size_wide[bsize];
  set_mi_row_col(xd, tile, mi_row, bh, mi_col, bw, mi_params->mi_rows,
                 mi_params->mi_cols);

  xd->above_txfm_context = cm->above_contexts.txfm[tile->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  write_mbmi_b(cpi, td, w);

  for (int plane = 0; plane < AOMMIN(2, av1_num_planes(cm)); ++plane) {
    const uint8_t palette_size_plane =
        mbmi->palette_mode_info.palette_size[plane];
    assert(!mbmi->skip_mode || !palette_size_plane);
    if (palette_size_plane > 0) {
      assert(mbmi->use_intrabc == 0);
      assert(av1_allow_palette(cm->features.allow_screen_content_tools,
                               mbmi->bsize));
      assert(!plane || xd->is_chroma_ref);
      int rows, cols;
      av1_get_block_dimensions(mbmi->bsize, plane, xd, NULL, NULL, &rows,
                               &cols);
      assert(*tok < tok_end);
      MapCdf map_pb_cdf = plane ? tile_ctx->palette_uv_color_index_cdf
                                : tile_ctx->palette_y_color_index_cdf;
      pack_map_tokens(w, tok, palette_size_plane, rows * cols, map_pb_cdf);
    }
  }

  const int is_inter_tx = is_inter_block(mbmi);
  const int skip_txfm = mbmi->skip_txfm;
  const uint8_t segment_id = mbmi->segment_id;
  if (cm->features.tx_mode == TX_MODE_SELECT && block_signals_txsize(bsize) &&
      !(is_inter_tx && skip_txfm) && !xd->lossless[segment_id]) {
    if (is_inter_tx) {  // This implies skip flag is 0.
      const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, bsize, 0);
      const int txbh = tx_size_high_unit[max_tx_size];
      const int txbw = tx_size_wide_unit[max_tx_size];
      const int width = mi_size_wide[bsize];
      const int height = mi_size_high[bsize];
      for (int idy = 0; idy < height; idy += txbh) {
        for (int idx = 0; idx < width; idx += txbw) {
          write_tx_size_vartx(xd, mbmi, max_tx_size, 0, idy, idx, w);
        }
      }
    } else {
      write_selected_tx_size(xd, w);
      set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height, 0, xd);
    }
  } else {
    set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height,
                  skip_txfm && is_inter_tx, xd);
  }

  if (!mbmi->skip_txfm) {
    int start = aom_tell_size(w);

    write_tokens_b(cpi, &td->mb, w, tok, tok_end);

    const int end = aom_tell_size(w);
    td->coefficient_size += end - start;
  }
}